

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::IfcSpace(IfcSpace *this)

{
  *(undefined ***)&this->field_0x198 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(char **)&this->field_0x1a8 = "IfcSpace";
  IfcSpatialStructureElement::IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__00806900);
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x160 = 0;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x8067f8;
  *(undefined8 *)&this->field_0x198 = 0x8068e8;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x806820;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x806848;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x806870;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0x806898;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0x8068c0;
  *(undefined1 **)&(this->super_IfcSpatialStructureElement).field_0x168 = &this->field_0x178;
  *(undefined8 *)&this->field_0x170 = 0;
  this->field_0x178 = 0;
  (this->ElevationWithFlooring).have = false;
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}